

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
wasm::read_file<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,wasm *this,string *filename,BinaryOption binary)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_3c0 [8];
  ifstream infile;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  this_00 = (do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0xddaaf8;
  iVar3 = std::__cxx11::string::compare((char *)this);
  if (iVar3 == 0) {
    do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Loading \'",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)this,*(long *)(this + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'...\n",5);
  }
  std::ifstream::ifstream(local_3c0);
  Path::to_path((PathString *)local_1b8,(string *)this);
  std::ifstream::open(local_3c0,(_Ios_Openmode)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    Fatal::Fatal((Fatal *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Failed opening \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),*(char **)this,*(long *)(this + 8));
    Fatal::operator<<((Fatal *)local_1b8,(char (*) [2])0xe74dbf);
  }
  else {
    std::istream::seekg((long)local_3c0,_S_beg);
    lVar5 = std::istream::tellg();
    if (lVar5 != -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)lVar5);
      if (lVar5 != 0) {
        std::istream::seekg(local_3c0,0,0);
        std::istream::read((char *)local_3c0,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
        if ((int)filename == 1) {
          std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)infile);
        }
      }
      std::ifstream::~ifstream(local_3c0);
      return __return_storage_ptr__;
    }
    Fatal::Fatal((Fatal *)local_1b8);
    poVar4 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed opening \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,*(char **)this,*(long *)(this + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\': Input file too large: ",0x19);
    std::ostream::_M_insert<long>((long)poVar4);
    Fatal::operator<<((Fatal *)local_1b8,(char (*) [39])" bytes. Try rebuilding in 64-bit mode.");
  }
  Fatal::~Fatal((Fatal *)local_1b8);
}

Assistant:

T wasm::read_file(const std::string& filename, Flags::BinaryOption binary) {
  if (filename == "-") {
    return do_read_stdin<T>{}();
  }
  BYN_TRACE("Loading '" << filename << "'...\n");
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in;
  if (binary == Flags::Binary) {
    flags |= std::ifstream::binary;
  }
  infile.open(wasm::Path::to_path(filename), flags);
  if (!infile.is_open()) {
    Fatal() << "Failed opening '" << filename << "'";
  }
  infile.seekg(0, std::ios::end);
  std::streampos insize = infile.tellg();
  if (uint64_t(insize) >= std::numeric_limits<size_t>::max()) {
    // Building a 32-bit executable where size_t == 32 bits, we are not able to
    // create strings larger than 2^32 bytes in length, so must abort here.
    Fatal() << "Failed opening '" << filename
            << "': Input file too large: " << insize
            << " bytes. Try rebuilding in 64-bit mode.";
  }
  // Zero-initialize the string or vector with the expected size.
  T input(size_t(insize), '\0');
  if (size_t(insize) == 0) {
    return input;
  }
  infile.seekg(0);
  infile.read(&input[0], insize);
  if (binary == Flags::Text) {
    size_t chars = size_t(infile.gcount());
    // Truncate size to the number of ASCII characters actually read in text
    // mode (which is generally less than the number of bytes on Windows, if
    // \r\n line endings are present)
    input.resize(chars);
  }
  return input;
}